

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

internals * pybind11::detail::get_internals(void)

{
  bool bVar1;
  int iVar2;
  PyObject *ptr;
  internals *this;
  forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
  *this_00;
  bool local_d2;
  _lambda_std____exception_ptr__exception_ptr__1_ local_d1;
  _func_void_exception_ptr *local_d0;
  item_accessor local_c8;
  capsule local_a8;
  long local_a0;
  PyThreadState *tstate;
  object local_78;
  capsule local_70;
  byte local_65;
  byte local_51;
  item_accessor local_50;
  handle local_30;
  PyObject *local_28;
  char *local_20;
  char *id;
  handle builtins;
  
  if (get_internals::internals_ptr == (internals *)0x0) {
    ptr = (PyObject *)PyEval_GetBuiltins();
    handle::handle((handle *)&id,ptr);
    local_20 = "__pybind11_2_1__";
    bVar1 = object_api<pybind11::handle>::contains<char_const*&>
                      ((object_api<pybind11::handle> *)&id,&local_20);
    local_51 = 0;
    local_65 = 0;
    local_d2 = false;
    if (bVar1) {
      object_api<pybind11::handle>::operator[]
                (&local_50,(object_api<pybind11::handle> *)&id,local_20);
      local_51 = 1;
      accessor::operator_cast_to_object((accessor *)&local_30);
      local_65 = 1;
      local_28 = local_30.m_ptr;
      local_d2 = isinstance<pybind11::capsule,_0>(local_30);
    }
    if ((local_65 & 1) != 0) {
      pybind11::object::~object((object *)&local_30);
    }
    if ((local_51 & 1) != 0) {
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_50);
    }
    if (local_d2 == false) {
      this = (internals *)operator_new(0x168);
      memset(this,0,0x168);
      internals::internals(this);
      get_internals::internals_ptr = this;
      PyEval_InitThreads();
      local_a0 = PyThreadState_Get();
      iVar2 = PyThread_create_key();
      get_internals::internals_ptr->tstate = iVar2;
      PyThread_set_key_value(get_internals::internals_ptr->tstate,local_a0);
      get_internals::internals_ptr->istate = *(PyInterpreterState **)(local_a0 + 0x10);
      capsule::capsule(&local_a8,get_internals::internals_ptr,(_func_void_PyObject_ptr *)0x0);
      object_api<pybind11::handle>::operator[]
                (&local_c8,(object_api<pybind11::handle> *)&id,local_20);
      accessor<pybind11::detail::accessor_policies::generic_item>::operator=(&local_c8,&local_a8);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor(&local_c8);
      capsule::~capsule(&local_a8);
      this_00 = &get_internals::internals_ptr->registered_exception_translators;
      local_d0 = get_internals()::{lambda(std::__exception_ptr::exception_ptr)#1}::
                 operator_cast_to_function_pointer(&local_d1);
      std::
      forward_list<void_(*)(std::__exception_ptr::exception_ptr),_std::allocator<void_(*)(std::__exception_ptr::exception_ptr)>_>
      ::push_front(this_00,&local_d0);
    }
    else {
      object_api<pybind11::handle>::operator[]
                ((item_accessor *)&tstate,(object_api<pybind11::handle> *)&id,local_20);
      accessor::operator_cast_to_object((accessor *)&local_78);
      capsule::capsule(&local_70,&local_78);
      get_internals::internals_ptr = capsule::operator_cast_to_internals_(&local_70);
      capsule::~capsule(&local_70);
      pybind11::object::~object(&local_78);
      accessor<pybind11::detail::accessor_policies::generic_item>::~accessor
                ((accessor<pybind11::detail::accessor_policies::generic_item> *)&tstate);
    }
    builtins.m_ptr = (PyObject *)get_internals::internals_ptr;
  }
  else {
    builtins.m_ptr = (PyObject *)get_internals::internals_ptr;
  }
  get_internals::internals_ptr = (internals *)builtins.m_ptr;
  return (internals *)builtins.m_ptr;
}

Assistant:

PYBIND11_NOINLINE inline internals &get_internals() {
    static internals *internals_ptr = nullptr;
    if (internals_ptr)
        return *internals_ptr;
    handle builtins(PyEval_GetBuiltins());
    const char *id = PYBIND11_INTERNALS_ID;
    if (builtins.contains(id) && isinstance<capsule>(builtins[id])) {
        internals_ptr = capsule(builtins[id]);
    } else {
        internals_ptr = new internals();
        #if defined(WITH_THREAD)
            PyEval_InitThreads();
            PyThreadState *tstate = PyThreadState_Get();
            internals_ptr->tstate = PyThread_create_key();
            PyThread_set_key_value(internals_ptr->tstate, tstate);
            internals_ptr->istate = tstate->interp;
        #endif
        builtins[id] = capsule(internals_ptr);
        internals_ptr->registered_exception_translators.push_front(
            [](std::exception_ptr p) -> void {
                try {
                    if (p) std::rethrow_exception(p);
                } catch (error_already_set &e)           { e.restore();                                    return;
                } catch (const builtin_exception &e)     { e.set_error();                                  return;
                } catch (const std::bad_alloc &e)        { PyErr_SetString(PyExc_MemoryError,   e.what()); return;
                } catch (const std::domain_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::invalid_argument &e) { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::length_error &e)     { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::out_of_range &e)     { PyErr_SetString(PyExc_IndexError,    e.what()); return;
                } catch (const std::range_error &e)      { PyErr_SetString(PyExc_ValueError,    e.what()); return;
                } catch (const std::exception &e)        { PyErr_SetString(PyExc_RuntimeError,  e.what()); return;
                } catch (...) {
                    PyErr_SetString(PyExc_RuntimeError, "Caught an unknown exception!");
                    return;
                }
            }
        );
    }
    return *internals_ptr;
}